

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-xref.c
# Opt level: O0

pdf_obj * pdf_read_old_xref(hd_context *ctx,pdf_document *doc,pdf_lexbuf *buf)

{
  pdf_document *ctx_00;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  pdf_xref_entry *ppVar4;
  longlong lVar5;
  pdf_obj *ppVar6;
  bool bVar7;
  pdf_xref_entry *entry;
  char *s;
  size_t n;
  pdf_xref_entry *ppStack_48;
  pdf_token tok;
  pdf_xref_entry *table;
  hd_stream *file;
  int carried;
  int xref_len;
  int i;
  int c;
  int len;
  int start;
  pdf_lexbuf *buf_local;
  pdf_document *doc_local;
  hd_context *ctx_local;
  
  table = (pdf_xref_entry *)doc->file;
  _len = buf;
  buf_local = (pdf_lexbuf *)doc;
  doc_local = (pdf_document *)ctx;
  file._4_4_ = pdf_xref_size_from_old_trailer(ctx,doc,buf);
  hd_skip_space((hd_context *)doc_local,(hd_stream *)buf_local->scratch);
  iVar1 = hd_skip_string((hd_context *)doc_local,(hd_stream *)buf_local->scratch,"xref");
  if (iVar1 != 0) {
    hd_throw((hd_context *)doc_local,2,"cannot find xref marker");
  }
  hd_skip_space((hd_context *)doc_local,(hd_stream *)buf_local->scratch);
  while ((xref_len = hd_peek_byte((hd_context *)doc_local,(hd_stream *)table), 0x2f < xref_len &&
         (xref_len < 0x3a))) {
    hd_read_line((hd_context *)doc_local,(hd_stream *)table,_len->scratch,(long)_len->size);
    entry = (pdf_xref_entry *)_len->scratch;
    pcVar2 = hd_strsep((char **)&entry," ");
    c = atoi(pcVar2);
    pcVar2 = hd_strsep((char **)&entry," ");
    i = atoi(pcVar2);
    if ((entry != (pdf_xref_entry *)0x0) && (entry->type != '\0')) {
      hd_warn((hd_context *)doc_local,"broken xref subsection. proceeding anyway.");
      ctx_00 = doc_local;
      ppVar4 = table;
      sVar3 = strlen(&entry->type);
      hd_seek((hd_context *)ctx_00,(hd_stream *)ppVar4,(long)-((int)sVar3 + 2),1);
    }
    if ((((c < 0) || (0x7fffff < c)) || (i < 0)) || ((0x7fffff < i || (0x7fffff < c + i + -1)))) {
      hd_throw((hd_context *)doc_local,2,"xref subsection object numbers are out of range");
    }
    if (file._4_4_ < c + i) {
      hd_warn((hd_context *)doc_local,"broken xref subsection, proceeding anyway.");
    }
    ppStack_48 = pdf_xref_find_subsection((hd_context *)doc_local,(pdf_document *)buf_local,c,i);
    file._0_4_ = 0;
    for (carried = 0; carried < i; carried = carried + 1) {
      ppVar4 = ppStack_48 + carried;
      s = (char *)hd_read((hd_context *)doc_local,(hd_stream *)table,
                          (uchar *)(_len->scratch + (int)(uint)file),(long)(int)(0x14 - (uint)file))
      ;
      if (s != (char *)(long)(int)(0x14 - (uint)file)) {
        hd_throw((hd_context *)doc_local,2,"unexpected EOF in xref table");
      }
      s = s + (int)(uint)file;
      if (ppVar4->type == '\0') {
        entry = (pdf_xref_entry *)_len->scratch;
        while( true ) {
          bVar7 = false;
          if (entry->type != '\0') {
            iVar1 = iswhite((int)entry->type);
            bVar7 = iVar1 != 0;
          }
          if (!bVar7) break;
          entry = (pdf_xref_entry *)&entry->flags;
        }
        lVar5 = atoll(&entry->type);
        ppVar4->ofs = (hd_off_t)lVar5;
        iVar1 = atoi((char *)((long)&entry->ofs + 3));
        ppVar4->gen = (unsigned_short)iVar1;
        ppVar4->num = c + carried;
        ppVar4->type = *(char *)((long)&entry->stm_buf + 1);
        if (((*(char *)((long)&entry->stm_buf + 1) != 'f') &&
            (*(char *)((long)&entry->stm_buf + 1) != 'n')) &&
           (*(char *)((long)&entry->stm_buf + 1) != 'o')) {
          hd_throw((hd_context *)doc_local,2,"unexpected xref type: 0x%x (%d %d R)",
                   (ulong)(uint)(int)*(char *)((long)&entry->stm_buf + 1),(ulong)(uint)ppVar4->num,
                   (ulong)ppVar4->gen);
        }
        file._0_4_ = (uint)(' ' < *(char *)((long)&entry->stm_buf + 3));
        if ((uint)file != 0) {
          entry->type = *(char *)((long)&entry->stm_buf + 3);
        }
      }
    }
    if ((uint)file != 0) {
      hd_unread_byte((hd_context *)doc_local,(hd_stream *)table);
    }
  }
  n._4_4_ = pdf_lex((hd_context *)doc_local,(hd_stream *)table,_len);
  if (n._4_4_ != PDF_TOK_TRAILER) {
    hd_throw((hd_context *)doc_local,2,"expected trailer marker");
  }
  n._4_4_ = pdf_lex((hd_context *)doc_local,(hd_stream *)table,_len);
  if (n._4_4_ == PDF_TOK_OPEN_DICT) {
    ppVar6 = pdf_parse_dict((hd_context *)doc_local,(pdf_document *)buf_local,(hd_stream *)table,
                            _len);
    return ppVar6;
  }
  hd_throw((hd_context *)doc_local,2,"expected trailer dictionary");
}

Assistant:

static pdf_obj *
pdf_read_old_xref(hd_context *ctx, pdf_document *doc, pdf_lexbuf *buf)
{
    int start, len, c, i, xref_len, carried;
    hd_stream *file = doc->file;
    pdf_xref_entry *table;
    pdf_token tok;
    size_t n;
    char *s;

    xref_len = pdf_xref_size_from_old_trailer(ctx, doc, buf);

	hd_skip_space(ctx, doc->file);
	if (hd_skip_string(ctx, doc->file, "xref"))
		hd_throw(ctx, HD_ERROR_GENERIC, "cannot find xref marker");
	hd_skip_space(ctx, doc->file);
	
	while (1)
	{
		c = hd_peek_byte(ctx, file);
		if (!(c >= '0' && c <= '9'))
			break;

		hd_read_line(ctx, file, buf->scratch, buf->size);
		s = buf->scratch;
		start = atoi(hd_strsep(&s, " "));
		len = atoi(hd_strsep(&s, " "));

		/* broken pdfs where the section is not on a separate line */
		if (s && *s != '\0')
		{
			hd_warn(ctx, "broken xref subsection. proceeding anyway.");
			hd_seek(ctx, file, -(2 + (int)strlen(s)), SEEK_CUR);
		}

		if (start < 0 || start > PDF_MAX_OBJECT_NUMBER
			|| len < 0 || len > PDF_MAX_OBJECT_NUMBER
			|| start + len - 1 > PDF_MAX_OBJECT_NUMBER)
		{
			hd_throw(ctx, HD_ERROR_GENERIC, "xref subsection object numbers are out of range");
		}
		/* broken pdfs where size in trailer undershoots entries in xref sections */
		if (start + len > xref_len)
		{
			hd_warn(ctx, "broken xref subsection, proceeding anyway.");
		}

		table = pdf_xref_find_subsection(ctx, doc, start, len);
		/* Xref entries SHOULD be 20 bytes long, but we see 19 byte
			 * ones more frequently than we'd like (e.g. PCLm drivers).
			 * Cope with this by 'carrying' data forward. */
		carried = 0;
		for (i = 0; i < len; i++)
		{
			pdf_xref_entry *entry = &table[i];
			n = hd_read(ctx, file, (unsigned char *) buf->scratch + carried, 20-carried);
			if (n != 20-carried)
				hd_throw(ctx, HD_ERROR_GENERIC, "unexpected EOF in xref table");
			n += carried;
			if (!entry->type)
			{
				s = buf->scratch;

				/* broken pdfs where line start with white space */
				while (*s != '\0' && iswhite(*s))
					s++;

				entry->ofs = atoll(s);
				entry->gen = atoi(s + 11);
				entry->num = start + i;
				entry->type = s[17];
				if (s[17] != 'f' && s[17] != 'n' && s[17] != 'o')
					hd_throw(ctx, HD_ERROR_GENERIC, "unexpected xref type: 0x%x (%d %d R)", s[17], entry->num, entry->gen);
				/* If the last byte of our buffer isn't an EOL (or space), carry one byte forward */
				carried = s[19] > 32;
				if (carried)
					s[0] = s[19];
			}
		}
		if (carried)
			hd_unread_byte(ctx, file);
	}

	tok = pdf_lex(ctx, file, buf);
	if (tok != PDF_TOK_TRAILER)
		hd_throw(ctx, HD_ERROR_GENERIC, "expected trailer marker");

	tok = pdf_lex(ctx, file, buf);
	if (tok != PDF_TOK_OPEN_DICT)
		hd_throw(ctx, HD_ERROR_GENERIC, "expected trailer dictionary");

	return pdf_parse_dict(ctx, doc, file, buf);
}